

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

bool __thiscall jpgd::jpeg_decoder::calc_mcu_block_order(jpeg_decoder *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  lVar9 = (long)this->m_comps_in_frame;
  if (lVar9 < 1) {
    iVar8 = 0;
    iVar6 = 0;
  }
  else {
    lVar5 = 0;
    iVar6 = 0;
    iVar8 = 0;
    do {
      if (iVar8 < this->m_comp_h_samp[lVar5]) {
        iVar8 = this->m_comp_h_samp[lVar5];
      }
      if (iVar6 < this->m_comp_v_samp[lVar5]) {
        iVar6 = this->m_comp_v_samp[lVar5];
      }
      lVar5 = lVar5 + 1;
    } while (lVar9 != lVar5);
  }
  if (0 < this->m_comps_in_frame) {
    iVar10 = this->m_image_x_size;
    iVar4 = this->m_image_y_size;
    lVar5 = 0;
    do {
      iVar3 = (this->m_comp_h_samp[lVar5] * iVar10 + iVar8 + -1) / iVar8;
      iVar7 = iVar3 + 7;
      iVar3 = iVar3 + 0xe;
      if (-1 < iVar7) {
        iVar3 = iVar7;
      }
      this->m_comp_h_blocks[lVar5] = iVar3 >> 3;
      iVar3 = (this->m_comp_v_samp[lVar5] * iVar4 + iVar6 + -1) / iVar6;
      iVar7 = iVar3 + 7;
      iVar3 = iVar3 + 0xe;
      if (-1 < iVar7) {
        iVar3 = iVar7;
      }
      this->m_comp_v_blocks[lVar5] = iVar3 >> 3;
      lVar5 = lVar5 + 1;
    } while (lVar9 != lVar5);
  }
  if (this->m_comps_in_scan == 1) {
    this->m_mcus_per_row = this->m_comp_h_blocks[this->m_comp_list[0]];
    iVar6 = this->m_comp_v_blocks[this->m_comp_list[0]];
  }
  else {
    iVar10 = this->m_image_x_size + 7;
    iVar4 = this->m_image_x_size + 0xe;
    if (-1 < iVar10) {
      iVar4 = iVar10;
    }
    this->m_mcus_per_row = ((iVar4 >> 3) + iVar8 + -1) / iVar8;
    iVar8 = this->m_image_y_size + 7;
    iVar10 = this->m_image_y_size + 0xe;
    if (-1 < iVar8) {
      iVar10 = iVar8;
    }
    iVar6 = (iVar6 + (iVar10 >> 3) + -1) / iVar6;
  }
  this->m_mcus_per_col = iVar6;
  if (this->m_comps_in_scan == 1) {
    this->m_mcu_org[0] = this->m_comp_list[0];
    this->m_blocks_per_mcu = 1;
  }
  else {
    this->m_blocks_per_mcu = 0;
    if (0 < this->m_comps_in_scan) {
      lVar9 = 0;
      do {
        iVar6 = this->m_comp_list[lVar9];
        for (iVar8 = this->m_comp_v_samp[iVar6] * this->m_comp_h_samp[iVar6]; iVar8 != 0;
            iVar8 = iVar8 + -1) {
          iVar10 = this->m_blocks_per_mcu;
          this->m_blocks_per_mcu = iVar10 + 1;
          this->m_mcu_org[iVar10] = iVar6;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->m_comps_in_scan);
    }
  }
  uVar1 = this->m_blocks_per_mcu;
  if (this->m_max_blocks_per_mcu < (int)uVar1) {
    bVar2 = false;
  }
  else {
    bVar2 = (int)uVar1 < 1;
    if ((0 < (int)uVar1) && (this->m_mcu_org[0] < 4)) {
      lVar9 = 0;
      do {
        lVar5 = lVar9;
        if ((ulong)uVar1 - 1 == lVar5) break;
        lVar9 = lVar5 + 1;
      } while (this->m_mcu_org[lVar5 + 1] < 4);
      return (ulong)uVar1 <= lVar5 + 1U;
    }
  }
  return bVar2;
}

Assistant:

bool jpeg_decoder::calc_mcu_block_order()
	{
		int component_num, component_id;
		int max_h_samp = 0, max_v_samp = 0;

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			if (m_comp_h_samp[component_id] > max_h_samp)
				max_h_samp = m_comp_h_samp[component_id];

			if (m_comp_v_samp[component_id] > max_v_samp)
				max_v_samp = m_comp_v_samp[component_id];
		}

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			m_comp_h_blocks[component_id] = ((((m_image_x_size * m_comp_h_samp[component_id]) + (max_h_samp - 1)) / max_h_samp) + 7) / 8;
			m_comp_v_blocks[component_id] = ((((m_image_y_size * m_comp_v_samp[component_id]) + (max_v_samp - 1)) / max_v_samp) + 7) / 8;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcus_per_row = m_comp_h_blocks[m_comp_list[0]];
			m_mcus_per_col = m_comp_v_blocks[m_comp_list[0]];
		}
		else
		{
			m_mcus_per_row = (((m_image_x_size + 7) / 8) + (max_h_samp - 1)) / max_h_samp;
			m_mcus_per_col = (((m_image_y_size + 7) / 8) + (max_v_samp - 1)) / max_v_samp;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcu_org[0] = m_comp_list[0];

			m_blocks_per_mcu = 1;
		}
		else
		{
			m_blocks_per_mcu = 0;

			for (component_num = 0; component_num < m_comps_in_scan; component_num++)
			{
				int num_blocks;

				component_id = m_comp_list[component_num];

				num_blocks = m_comp_h_samp[component_id] * m_comp_v_samp[component_id];

				while (num_blocks--)
					m_mcu_org[m_blocks_per_mcu++] = component_id;
			}
		}

		if (m_blocks_per_mcu > m_max_blocks_per_mcu)
			return false;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			int comp_id = m_mcu_org[mcu_block];
			if (comp_id >= JPGD_MAX_QUANT_TABLES)
				return false;
		}

		return true;
	}